

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_draw_config(t_vu *x,_glist *glist)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  _glist *p_Var8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  undefined8 uVar17;
  t_atom fontatoms [3];
  char tag [128];
  
  p_Var8 = (x->x_gui).x_glist;
  uVar1 = p_Var8->gl_zoom;
  p_Var8 = glist_getcanvas(p_Var8);
  iVar3 = text_xpix((t_text *)x,glist);
  uVar4 = text_ypix((t_text *)x,glist);
  uVar5 = x->x_led_size * uVar1;
  iVar7 = (x->x_gui).x_w;
  uVar6 = iVar7 / 4 + iVar3;
  iVar13 = (x->x_led_size + 1) * uVar1;
  fontatoms[0].a_type = A_SYMBOL;
  fontatoms[0].a_w.w_symbol = gensym((x->x_gui).x_font);
  fontatoms[1].a_type = A_FLOAT;
  fontatoms[1].a_w._0_4_ = (undefined4)(int)-((x->x_gui).x_fontsize * uVar1);
  fontatoms[2].a_type = A_SYMBOL;
  fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
  sprintf(tag,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",tag,(ulong)(iVar3 - uVar1),
              (ulong)(uVar4 + uVar1 * -2),(ulong)(iVar3 + uVar1 + (x->x_gui).x_w),
              (ulong)(uVar4 + uVar1 * 2 + (x->x_gui).x_h));
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var8,"itemconfigure",tag,"-width",(ulong)uVar1,"-fill",
              (ulong)(uint)(x->x_gui).x_bcol);
  sprintf(tag,"%lxSCALE",x);
  uVar14 = 0xff;
  if (((x->x_gui).x_fsf.field_0x3 & 1) == 0) {
    uVar14 = (ulong)(uint)(x->x_gui).x_lcol;
  }
  uVar9 = (ulong)(uint)(iVar7 / 2 + iVar3);
  uVar10 = (iVar7 + iVar3) - iVar7 / 4;
  iVar7 = iVar7 + iVar3 + uVar1 * 4;
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var8,"itemconfigure",tag,"-font",3,fontatoms,"-fill",uVar14)
  ;
  sprintf(tag,"%lxRLED",x);
  pdgui_vmess((char *)0x0,"crs ri",p_Var8,"itemconfigure",tag,"-width",(ulong)uVar5);
  uVar16 = uVar4 + iVar13 * 0x28;
  for (lVar11 = -0x29; lVar11 != 0; lVar11 = lVar11 + 1) {
    uVar12 = (int)lVar11 + 0x2a;
    sprintf(tag,"%lxRLED%d",x,(ulong)uVar12);
    iVar2 = iemgui_vu_col[lVar11 + 0x2a];
    uVar14 = (ulong)(iVar13 / -2 + uVar16);
    pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",tag,(ulong)(uVar6 + uVar1),uVar14,
                (ulong)uVar10,uVar14);
    pdgui_vmess((char *)0x0,"crs rk",p_Var8,"itemconfigure",tag,"-fill",
                (ulong)(uint)iemgui_color_hex[iVar2]);
    sprintf(tag,"%lxSCALE%d",x,(ulong)uVar12);
    pdgui_vmess((char *)0x0,"crs ii",p_Var8,"coords",tag,iVar7,(ulong)uVar16);
    if ((uVar12 & 3) != 2) {
      pcVar15 = "";
      if (x->x_scale != 0) {
        pcVar15 = iemgui_vu_scale_str[lVar11 + 0x2a];
      }
      pdgui_vmess((char *)0x0,"crs rs",p_Var8,"itemconfigure",tag,"-text",pcVar15);
    }
    uVar16 = uVar16 - iVar13;
  }
  uVar17 = 0x16135c;
  sprintf(tag,"%lxSCALE%d",x,0x29);
  pdgui_vmess((char *)0x0,"crs ii",p_Var8,"coords",tag,iVar7,(ulong)uVar4);
  pcVar15 = iemgui_vu_scale_str[0x29];
  if (x->x_scale == 0) {
    pcVar15 = "";
  }
  pdgui_vmess((char *)0x0,"crs rs",p_Var8,"itemconfigure",tag,"-text",pcVar15);
  sprintf(tag,"%lxRCOVER",x,uVar17);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",tag,(ulong)uVar6,(ulong)(uVar4 - uVar1),
              (ulong)(uVar10 + uVar1),(ulong)(iVar13 * 0x28 + (uVar4 - uVar1)));
  uVar14 = (ulong)(uint)(x->x_gui).x_bcol;
  pdgui_vmess((char *)0x0,"crs rk rk",p_Var8,"itemconfigure",tag,"-fill",uVar14,"-outline",uVar14);
  sprintf(tag,"%lxPLED",x);
  uVar14 = (ulong)(uVar1 * 10 + uVar4);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",tag,uVar9,uVar14,uVar9,uVar14);
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var8,"itemconfigure",tag,"-width",(ulong)(uVar5 + uVar1),
              "-fill",(ulong)(uint)(x->x_gui).x_bcol);
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var8,"coords",tag,(ulong)((x->x_gui).x_ldx * uVar1 + iVar3),
              (ulong)(uVar1 * (x->x_gui).x_ldy + uVar4));
  uVar14 = 0xff;
  if (((x->x_gui).x_fsf.field_0x3 & 1) == 0) {
    uVar14 = (ulong)(uint)(x->x_gui).x_lcol;
  }
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var8,"itemconfigure",tag,"-font",3,fontatoms,"-fill",uVar14)
  ;
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  x->field_0x4b8 = x->field_0x4b8 | 3;
  return;
}

Assistant:

static void vu_draw_config(t_vu* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_iemgui *iemgui = &x->x_gui;
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int hmargin = HMARGIN * zoom, vmargin = VMARGIN * zoom;
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int ledw = x->x_led_size * zoom;
    int fs = x->x_gui.x_fontsize * zoom;
    int w4 = x->x_gui.x_w/4, mid = xpos + x->x_gui.x_w/2,
        quad1 = xpos + w4 + zoom;
    int quad3 = xpos + x->x_gui.x_w - w4,
        end = xpos + x->x_gui.x_w + 4*zoom;
    int k1 = (x->x_led_size+1)*zoom, k2 = IEM_VU_STEPS+1, k3 = k1/2;
    int led_col, yyy, k4 = ypos - k3;
    int i;
    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos - hmargin, ypos - vmargin,
        xpos+x->x_gui.x_w + hmargin, ypos+x->x_gui.x_h + vmargin);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-fill", x->x_gui.x_bcol);

    sprintf(tag, "%lxSCALE", x);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_lcol);
    sprintf(tag, "%lxRLED", x);
    pdgui_vmess(0, "crs ri", canvas, "itemconfigure", tag, "-width", ledw);

    for(i = 1; i <= IEM_VU_STEPS + 1; i++)
    {
        sprintf(tag, "%lxRLED%d", x, i);
        led_col = iemgui_vu_col[i];
        yyy = k4 + k1*(k2-i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            quad1, yyy, quad3, yyy);
        pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag,
            "-fill", iemgui_color_hex[led_col]);

        sprintf(tag, "%lxSCALE%d", x, i);
        pdgui_vmess(0, "crs ii", canvas, "coords", tag,
            end, yyy + k3);
        if((i+2) & 3)
            pdgui_vmess(0, "crs rs", canvas, "itemconfigure", tag,
            "-text", (x->x_scale)?iemgui_vu_scale_str[i]:"");
    }

    i = IEM_VU_STEPS + 1;
    yyy = k4 + k1 * (k2 - i);

        /* this was already set in the loop above, overwritten here */
    sprintf(tag, "%lxSCALE%d", x, i);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        end, yyy + k3);

    pdgui_vmess(0, "crs rs", canvas, "itemconfigure", tag,
        "-text", (x->x_scale)?iemgui_vu_scale_str[i]:"");

    sprintf(tag, "%lxRCOVER", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        quad1 - zoom, ypos - zoom,
        quad3 + zoom, ypos - zoom + k1*IEM_VU_STEPS);
    pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
        "-fill", x->x_gui.x_bcol, "-outline", x->x_gui.x_bcol);

    sprintf(tag, "%lxPLED", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        mid, ypos + PEAKHEIGHT * zoom,
        mid, ypos + PEAKHEIGHT * zoom);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", ledw+zoom, /* peak LED is slightly fatter */
        "-fill", x->x_gui.x_bcol);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xpos+x->x_gui.x_ldx * zoom, ypos+x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);

    x->x_updaterms = x->x_updatepeak = 1;
}